

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall Catch::Matchers::EndsWithMatcher::match(EndsWithMatcher *this,string *source)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  uVar1 = (this->super_StringMatcherBase).m_comparator.m_str._M_string_length;
  if (local_30._M_string_length < uVar1) {
    bVar4 = false;
  }
  else if (uVar1 == 0) {
    bVar4 = true;
  }
  else {
    lVar3 = -1;
    do {
      bVar4 = (this->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p[lVar3 + uVar1] ==
              local_30._M_dataplus._M_p[lVar3 + local_30._M_string_length];
      if (!bVar4) break;
      uVar2 = -lVar3;
      lVar3 = lVar3 + -1;
    } while (uVar2 != uVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool EndsWithMatcher::match(std::string const &source) const {
            return endsWith(m_comparator.adjustString(source), m_comparator.m_str);
        }